

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O3

void lvm_debug_u(void)

{
  uint uVar1;
  int iVar2;
  vm_register *pvVar3;
  uint uVar4;
  
  uasm_flag = true;
  uVar1 = registe_ptr->IP;
  pvVar3 = registe_ptr;
  uVar4 = uVar1;
  if (uVar1 != registe_ptr->CS + m_code_length) {
    do {
      printf("%08X   ",(ulong)uVar4);
      iVar2 = get_ins_len(code_ptr[registe_ptr->IP],code_ptr[registe_ptr->IP + 1]);
      lvm_debug_u_print(code_ptr[registe_ptr->IP],code_ptr[registe_ptr->IP + 1]);
      pvVar3 = registe_ptr;
      uVar4 = iVar2 + registe_ptr->IP;
      registe_ptr->IP = uVar4;
    } while (uVar4 != pvVar3->CS + m_code_length);
  }
  pvVar3->IP = uVar1;
  uasm_flag = false;
  return;
}

Assistant:

void lvm_debug_u() {
	uasm_flag = true;
	unsigned temp = registe_ptr->IP;//保存当前IP 为反汇编做准备
	while (registe_ptr->IP != m_code_length+registe_ptr->CS)
	{
		printf("%08X   ", registe_ptr->IP);
		int ins_len;
		ins_len = get_ins_len(code_ptr[registe_ptr->IP], code_ptr[registe_ptr->IP + 1]);//获取指令长度 为地址指针递增做准备
		lvm_debug_u_print(code_ptr[registe_ptr->IP], code_ptr[registe_ptr->IP + 1]);
		registe_ptr->IP += ins_len;
	}
	registe_ptr->IP = temp;
	uasm_flag = false;
}